

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O1

void __thiscall
solitaire::Solitaire::saveHistoryIfCardMovedToOtherPileAndClearHand
          (Solitaire *this,optional<solitaire::cards::Card> *cardToAdd,
          SnapshotPtr *destinationPileSnapshot)

{
  pointer pCVar1;
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> local_10;
  
  if ((cardToAdd->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
      super__Optional_payload_base<solitaire::cards::Card>._M_engaged == false) {
    local_10._M_head_impl =
         (destinationPileSnapshot->_M_t).
         super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
         ._M_t.
         super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
         .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl;
    (destinationPileSnapshot->_M_t).
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    saveHistoryIfCardMovedToOtherPile(this,(SnapshotPtr *)&local_10);
    if (local_10._M_head_impl != (Snapshot *)0x0) {
      (*(local_10._M_head_impl)->_vptr_Snapshot[1])();
    }
    pCVar1 = (this->cardsInHand).
             super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->cardsInHand).
        super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar1) {
      (this->cardsInHand).
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar1;
    }
  }
  return;
}

Assistant:

void Solitaire::saveHistoryIfCardMovedToOtherPileAndClearHand(
    const std::optional<Card>& cardToAdd, SnapshotPtr destinationPileSnapshot)
{
    if (isCardAdded(cardToAdd)) {
        saveHistoryIfCardMovedToOtherPile(std::move(destinationPileSnapshot));
        cardsInHand.clear();
    }
}